

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_ops.c
# Opt level: O3

long lookup_gnu_hash_symbol
               (char *name,Elf64_Sym *syms,Elf64_Half *versym,char *symnames,void *sheader)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ushort uVar5;
  int iVar6;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong local_60;
  
  uVar1 = *sheader;
  uVar2 = *(uint *)((long)sheader + 8);
  cVar8 = *name;
  if (cVar8 == '\0') {
    uVar10 = 0x1505;
  }
  else {
    pcVar7 = name + 1;
    uVar10 = 0x1505;
    do {
      uVar10 = uVar10 * 0x21 + (int)cVar8;
      cVar8 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar8 != '\0');
  }
  uVar9 = *(uint *)((long)sheader + ((ulong)uVar10 % (ulong)uVar1) * 4 + (ulong)uVar2 * 8 + 0x10);
  if (uVar9 == 0) {
    local_60 = 0xffffffffffffffff;
  }
  else {
    uVar5 = 0;
    iVar3 = *(int *)((long)sheader + 4);
    local_60 = 0xffffffffffffffff;
    do {
      uVar4 = *(uint *)((long)sheader +
                       (ulong)(uVar9 - iVar3) * 4 + (ulong)uVar1 * 4 + (ulong)uVar2 * 8 + 0x10);
      if ((uVar4 ^ uVar10) < 2) {
        uVar11 = (ulong)uVar9;
        iVar6 = strcmp(name,symnames + syms[uVar11].st_name);
        if (iVar6 == 0) {
          if (versym == (Elf64_Half *)0x0) {
            return uVar11;
          }
          if (uVar5 < (versym[uVar11] & 0x7fff)) {
            local_60 = uVar11;
            uVar5 = versym[uVar11] & 0x7fff;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while ((uVar4 & 1) == 0);
  }
  return local_60;
}

Assistant:

signed long lookup_gnu_hash_symbol(const char *name, ElfW(Sym) * syms,
                                   ElfW(Half) * versym, char *symnames,
                                   void *sheader) {
  uint32_t *buckets = NULL, *vals = NULL;
  uint32_t hash_val = 0;
  uint32_t cur_sym = 0, cur_sym_hashval = 0;
  signed long latest_sym = -1;
  ElfW(Half) latest_sym_ver = 0;
  struct gnu_hash_header *header = (struct gnu_hash_header *)(sheader);

  buckets = (uint32_t *)(((unsigned char *)(header + 1)) +
                         (header->maskwords * sizeof(ElfW(Addr))));
  vals = buckets + header->nbuckets;

  hash_val = gnu_hash_func(name);
  cur_sym = buckets[hash_val % header->nbuckets];
  if (cur_sym == 0) {
    return -1;
  }

  hash_val &= ~1;
  for (;;) {
    cur_sym_hashval = vals[cur_sym - header->symndx];
    if (((cur_sym_hashval & ~1) == hash_val) &&
        (gotcha_strcmp(name, symnames + syms[cur_sym].st_name) == 0)) {
      if (!versym) {
        return (signed long)cur_sym;
      }

      if ((versym[cur_sym] & 0x7fff) > latest_sym_ver) {
        latest_sym = (signed long)cur_sym;
        latest_sym_ver = versym[cur_sym] & 0x7fff;
      }
    }
    if (cur_sym_hashval & 1) {
      break;
    }
    cur_sym++;
  }

  return latest_sym;
}